

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

size_t __thiscall edition_unittest::TestUnpackedTypes::ByteSizeLong(TestUnpackedTypes *this)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_int> *pRVar2;
  RepeatedField<unsigned_long> *pRVar3;
  RepeatedField<int> *pRVar4;
  RepeatedField<float> *this_00;
  RepeatedField<double> *this_01;
  RepeatedField<bool> *this_02;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  size_t sVar26;
  size_t sVar27;
  size_t sVar28;
  size_t sVar29;
  size_t sVar30;
  size_t sVar31;
  size_t sVar32;
  
  sVar26 = google::protobuf::internal::WireFormatLite::Int32Size
                     (&(this->field_0)._impl_.unpacked_int32_);
  uVar5 = google::protobuf::internal::SooRep::size
                    ((SooRep *)&(this->field_0)._impl_,
                     (undefined1  [232])((undefined1  [232])this->field_0 & (undefined1  [232])0x4)
                     == (undefined1  [232])0x0);
  pRVar1 = &(this->field_0)._impl_.unpacked_int64_;
  sVar27 = google::protobuf::internal::WireFormatLite::Int64Size(pRVar1);
  uVar6 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,
                     (undefined1  [232])((undefined1  [232])this->field_0 & (undefined1  [232])0x4)
                     == (undefined1  [232])0x0);
  pRVar2 = &(this->field_0)._impl_.unpacked_uint32_;
  sVar28 = google::protobuf::internal::WireFormatLite::UInt32Size(pRVar2);
  uVar7 = google::protobuf::internal::SooRep::size
                    (&pRVar2->soo_rep_,(*(byte *)((long)&this->field_0 + 0x20) & 4) == 0);
  pRVar3 = &(this->field_0)._impl_.unpacked_uint64_;
  sVar29 = google::protobuf::internal::WireFormatLite::UInt64Size(pRVar3);
  uVar8 = google::protobuf::internal::SooRep::size
                    (&pRVar3->soo_rep_,(*(byte *)((long)&this->field_0 + 0x30) & 4) == 0);
  pRVar4 = &(this->field_0)._impl_.unpacked_sint32_;
  sVar30 = google::protobuf::internal::WireFormatLite::SInt32Size(pRVar4);
  uVar9 = google::protobuf::internal::SooRep::size
                    (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0x40) & 4) == 0);
  pRVar1 = &(this->field_0)._impl_.unpacked_sint64_;
  sVar31 = google::protobuf::internal::WireFormatLite::SInt64Size(pRVar1);
  uVar10 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x50) & 4) == 0);
  pRVar2 = &(this->field_0)._impl_.unpacked_fixed32_;
  uVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar2->soo_rep_,(*(byte *)((long)&this->field_0 + 0x60) & 4) == 0);
  uVar12 = google::protobuf::internal::SooRep::size
                     (&pRVar2->soo_rep_,(*(byte *)((long)&this->field_0 + 0x60) & 4) == 0);
  pRVar3 = &(this->field_0)._impl_.unpacked_fixed64_;
  uVar13 = google::protobuf::internal::SooRep::size
                     (&pRVar3->soo_rep_,(*(byte *)((long)&this->field_0 + 0x70) & 4) == 0);
  uVar14 = google::protobuf::internal::SooRep::size
                     (&pRVar3->soo_rep_,(*(byte *)((long)&this->field_0 + 0x70) & 4) == 0);
  pRVar4 = &(this->field_0)._impl_.unpacked_sfixed32_;
  uVar15 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0x80) & 4) == 0);
  uVar16 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0x80) & 4) == 0);
  pRVar1 = &(this->field_0)._impl_.unpacked_sfixed64_;
  uVar17 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x90) & 4) == 0);
  uVar18 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x90) & 4) == 0);
  this_00 = &(this->field_0)._impl_.unpacked_float_;
  uVar19 = google::protobuf::internal::SooRep::size
                     (&this_00->soo_rep_,(*(byte *)((long)&this->field_0 + 0xa0) & 4) == 0);
  uVar20 = google::protobuf::internal::SooRep::size
                     (&this_00->soo_rep_,(*(byte *)((long)&this->field_0 + 0xa0) & 4) == 0);
  this_01 = &(this->field_0)._impl_.unpacked_double_;
  uVar21 = google::protobuf::internal::SooRep::size
                     (&this_01->soo_rep_,(*(byte *)((long)&this->field_0 + 0xb0) & 4) == 0);
  uVar22 = google::protobuf::internal::SooRep::size
                     (&this_01->soo_rep_,(*(byte *)((long)&this->field_0 + 0xb0) & 4) == 0);
  this_02 = &(this->field_0)._impl_.unpacked_bool_;
  uVar23 = google::protobuf::internal::SooRep::size
                     (&this_02->soo_rep_,(*(byte *)((long)&this->field_0 + 0xc0) & 4) == 0);
  uVar24 = google::protobuf::internal::SooRep::size
                     (&this_02->soo_rep_,(*(byte *)((long)&this->field_0 + 0xc0) & 4) == 0);
  pRVar4 = &(this->field_0)._impl_.unpacked_enum_;
  sVar32 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar4);
  uVar25 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0xd0) & 4) == 0);
  sVar26 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                     (&this->super_Message,
                      sVar32 + uVar23 +
                      sVar31 + sVar30 + sVar29 + sVar28 + sVar27 + sVar26 +
                      ((ulong)uVar15 + (ulong)uVar11 + (ulong)uVar19) * 4 +
                      ((ulong)uVar17 + (ulong)uVar13 + (ulong)uVar21) * 8 +
                      ((ulong)uVar24 + (ulong)uVar22 + (ulong)uVar25 +
                      (ulong)uVar16 + (ulong)uVar14 + (ulong)uVar18 + (ulong)uVar20 +
                      (ulong)uVar10 + (ulong)uVar9 + (ulong)uVar12 +
                      (ulong)uVar8 + (ulong)uVar7 + (ulong)uVar6 + (ulong)uVar5) * 2,
                      &(this->field_0)._impl_._cached_size_);
  return sVar26;
}

Assistant:

::size_t TestUnpackedTypes::ByteSizeLong() const {
  const TestUnpackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestUnpackedTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 unpacked_int32 = 90 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_unpacked_int32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_int32_size());
      total_size += tag_size + data_size;
    }
    // repeated int64 unpacked_int64 = 91 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int64Size(
          this_._internal_unpacked_int64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_int64_size());
      total_size += tag_size + data_size;
    }
    // repeated uint32 unpacked_uint32 = 92 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::UInt32Size(
          this_._internal_unpacked_uint32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_uint32_size());
      total_size += tag_size + data_size;
    }
    // repeated uint64 unpacked_uint64 = 93 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::UInt64Size(
          this_._internal_unpacked_uint64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_uint64_size());
      total_size += tag_size + data_size;
    }
    // repeated sint32 unpacked_sint32 = 94 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::SInt32Size(
          this_._internal_unpacked_sint32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sint32_size());
      total_size += tag_size + data_size;
    }
    // repeated sint64 unpacked_sint64 = 95 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::SInt64Size(
          this_._internal_unpacked_sint64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sint64_size());
      total_size += tag_size + data_size;
    }
    // repeated fixed32 unpacked_fixed32 = 96 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_unpacked_fixed32_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_fixed32_size());
      total_size += tag_size + data_size;
    }
    // repeated fixed64 unpacked_fixed64 = 97 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_unpacked_fixed64_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_fixed64_size());
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 unpacked_sfixed32 = 98 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sfixed32_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sfixed32_size());
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 unpacked_sfixed64 = 99 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sfixed64_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sfixed64_size());
      total_size += tag_size + data_size;
    }
    // repeated float unpacked_float = 100 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_unpacked_float_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_float_size());
      total_size += tag_size + data_size;
    }
    // repeated double unpacked_double = 101 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_unpacked_double_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_double_size());
      total_size += tag_size + data_size;
    }
    // repeated bool unpacked_bool = 102 [features = {
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_unpacked_bool_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_bool_size());
      total_size += tag_size + data_size;
    }
    // repeated .edition_unittest.ForeignEnum unpacked_enum = 103 [features = {
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_unpacked_enum());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_enum_size());
      total_size += data_size + tag_size;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}